

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_rate_adapted_fer.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  unsigned_long num_frames_to_test;
  unsigned_long quit_at_n_errors;
  unsigned_long max_num_iter;
  unsigned_long __sd;
  unsigned_long update_console_every_n_frames;
  unsigned_long n_line_combs;
  ostream *poVar1;
  string *generalProgramDescriptionForHelpText;
  double p;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  pair<unsigned_long,_unsigned_long> pVar4;
  RateAdaptiveCode<unsigned_int> H;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> rate_adaption_file_path;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> code_file_path;
  string local_a88;
  Parser parser;
  mt19937_64 rng;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a88,
             "Frame Error Rate (FER) Simulator for Rate Adapted LDPC Codes\n\nThis software is used to \n- load an LDPC code (from a .cscmat or bincsc.json file storing the full binary LDPC matrix in compressed sparse column (CSC) format, no QC exponents allowed!)\n- load rate adaption (from a csv file, list of pairs of row indices combined at each rate adaption step)    (this is optional; without rate adaption, only FER of the LDPC code can be simulated)\n- Simulate the FER of the given LDPC code at specified amount of rate adaption."
             ,(allocator<char> *)&rng);
  generalProgramDescriptionForHelpText = &local_a88;
  cli::Parser::Parser(&parser,argc,argv,generalProgramDescriptionForHelpText);
  std::__cxx11::string::~string((string *)&local_a88);
  configure_parser(&parser);
  cli::Parser::run_and_exit_if_error(&parser);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"p",(allocator<char> *)&H);
  p = cli::Parser::get<double>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"mf",(allocator<char> *)&H);
  num_frames_to_test = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"me",(allocator<char> *)&H);
  quit_at_n_errors = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"i",(allocator<char> *)&H);
  max_num_iter = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"s",(allocator<char> *)&H);
  __sd = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"upn",(allocator<char> *)&H);
  update_console_every_n_frames = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"cp",(allocator<char> *)&H);
  cli::Parser::get<std::__cxx11::string>(&code_file_path,&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"rp",(allocator<char> *)&H);
  cli::Parser::get<std::__cxx11::string>(&rate_adaption_file_path,&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  std::__cxx11::string::string<std::allocator<char>>((string *)&rng,"rn",(allocator<char> *)&H);
  n_line_combs = cli::Parser::get<unsigned_long>(&parser,(string *)&rng);
  std::__cxx11::string::~string((string *)&rng);
  LDPC4QKD::CodeSimulationHelpers::load_ldpc<bool,unsigned_int,unsigned_int>
            (&H,(CodeSimulationHelpers *)&code_file_path,&rate_adaption_file_path,
             generalProgramDescriptionForHelpText);
  LDPC4QKD::RateAdaptiveCode<unsigned_int>::recompute_pos_vn_cn(&H,n_line_combs);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar1 = std::operator<<((ostream *)&std::cout,"Code path: \'");
  poVar1 = std::operator<<(poVar1,(string *)&code_file_path);
  std::operator<<(poVar1,"\'\n");
  poVar1 = std::operator<<((ostream *)&std::cout,"Rate adaption path: \'");
  poVar1 = std::operator<<(poVar1,(string *)&rate_adaption_file_path);
  std::operator<<(poVar1,"\'\n");
  std::operator<<((ostream *)&std::cout,"Running FER decoding test on channel parameter p : ");
  poVar1 = std::ostream::_M_insert<double>(p);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Max number of BP decoder iterations: ");
  poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,(int)max_num_iter);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Max number of frames to simulate: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Quit at n frame errors: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"PRNG seed: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Update console every n frames: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Code size before rate adaption: ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Code size after rate adaption (if applicable): ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," x ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1,"\n\n");
  std::endl<char,std::char_traits<char>>(poVar1);
  std::
  mersenne_twister_engine<unsigned_long,_64UL,_312UL,_156UL,_31UL,_13043109905998158313UL,_29UL,_6148914691236517205UL,_17UL,_8202884508482404352UL,_37UL,_18444473444759240704UL,_43UL,_6364136223846793005UL>
  ::seed(&rng,__sd);
  std::chrono::_V2::steady_clock::now();
  pVar4 = run_simulation<unsigned_int>
                    (&H,p,num_frames_to_test,&rng,max_num_iter,update_console_every_n_frames,
                     quit_at_n_errors);
  std::chrono::_V2::steady_clock::now();
  poVar1 = std::operator<<((ostream *)&std::cout,"\n\nDONE! Simulation time: ");
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  poVar1 = std::operator<<(poVar1," seconds.");
  std::operator<<(poVar1,'\n');
  poVar1 = std::operator<<((ostream *)&std::cout,"Recorded ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  poVar1 = std::operator<<(poVar1," frame errors out of ");
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::operator<<(poVar1," (FER~");
  auVar2._8_4_ = pVar4.first._4_4_;
  auVar2._0_8_ = pVar4.first;
  auVar2._12_4_ = 0x45300000;
  auVar3._8_4_ = pVar4.second._4_4_;
  auVar3._0_8_ = pVar4.second;
  auVar3._12_4_ = 0x45300000;
  poVar1 = std::ostream::_M_insert<double>
                     (((auVar2._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)pVar4.first) - 4503599627370496.0)) /
                      ((auVar3._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,(int)pVar4.second) - 4503599627370496.0)));
  poVar1 = std::operator<<(poVar1,")...");
  std::endl<char,std::char_traits<char>>(poVar1);
  exit(0);
}

Assistant:

int main(int argc, char *argv[]) {
    // parse command line arguments
    cli::Parser parser(argc, argv, help_text);
    configure_parser(parser);
    parser.run_and_exit_if_error();

    auto p = parser.get<double>("p");
    auto max_num_frames_to_test = parser.get<std::size_t>("mf");
    auto quit_at_n_errors = parser.get<std::size_t>("me");
    auto max_bp_iter = parser.get<std::size_t>("i");
    auto rng_seed = parser.get<std::size_t>("s");
    auto update_console_every_n_frames = parser.get<std::size_t>("upn");
    auto code_file_path = parser.get<std::string>("cp");
    auto rate_adaption_file_path = parser.get<std::string>("rp");
    auto n_line_combs = parser.get<std::size_t>("rn");

    // create LDPC code, with rate adaption if specified.
    auto H = load_ldpc(code_file_path, rate_adaption_file_path);
    // set rate adaption. Only works if rate adaption was specified!
    H.set_rate(n_line_combs);

    // print received arguments (simulation parameters)
    std::cout << std::endl;
    std::cout << "Code path: '" << code_file_path << "'\n";
    std::cout << "Rate adaption path: '" << rate_adaption_file_path << "'\n";
    std::cout << "Running FER decoding test on channel parameter p : " << p << '\n';
    std::cout << "Max number of BP decoder iterations: " << static_cast<int>(max_bp_iter) << '\n';
    std::cout << "Max number of frames to simulate: " << max_num_frames_to_test << '\n';
    std::cout << "Quit at n frame errors: " << quit_at_n_errors << '\n';
    std::cout << "PRNG seed: " << rng_seed << '\n';
    std::cout << "Update console every n frames: " << update_console_every_n_frames << '\n';
    std::cout << "Code size before rate adaption: " << H.get_n_rows_mother_matrix() << " x " << H.getNCols() << '\n';
    std::cout << "Code size after rate adaption (if applicable): "
              << H.get_n_rows_after_rate_adaption() << " x " << H.getNCols() << "\n\n" << std::endl;

    std::mt19937_64 rng(rng_seed);
    auto begin = std::chrono::steady_clock::now();

    // perform frame error rate simulation.
    std::pair<std::size_t, std::size_t> result = run_simulation(H, p, max_num_frames_to_test, rng,
                                                                max_bp_iter,
                                                                update_console_every_n_frames, quit_at_n_errors);
    std::size_t num_frame_errors = result.first;
    std::size_t num_frames_tested = result.second;
    double naive_fer = static_cast<double>(num_frame_errors) / static_cast<double>(num_frames_tested);

    auto now = std::chrono::steady_clock::now();
    std::cout << "\n\nDONE! Simulation time: " <<
              std::chrono::duration_cast<std::chrono::seconds>(now - begin).count() << " seconds." << '\n';

    std::cout << "Recorded " << num_frame_errors << " frame errors out of " << num_frames_tested
              << " (FER~" << naive_fer << ")..." << std::endl;

    exit(EXIT_SUCCESS);
}